

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::initializeComponent(HierarchicalTaskNetworkComponent *this)

{
  map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
  *this_00;
  ulong uVar1;
  HierarchicalTaskNetworkComponent *pHVar2;
  World *this_01;
  GameMode *this_02;
  TaskDatabase *this_03;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  mapped_type_conflict *pmVar5;
  mapped_type *pmVar6;
  int iVar7;
  allocator_type local_75;
  WorldStateIdentifier local_74;
  HierarchicalTaskNetworkComponent *local_70;
  _Any_data local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<float,_std::allocator<float>_> local_48;
  
  this_01 = Component::getWorld(&this->super_Component);
  this_02 = World::getAuthGameMode(this_01);
  GameMode::registerForFixedTicks(this_02,&this->super_IFixedTickable);
  WorldQuerier::setup(&this->worldQuerySystem,this_01,(this->super_Component).owner);
  this_03 = GameMode::getAvailableTasks(this_02);
  local_70 = this;
  for (p_Var4 = (this_03->considerations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this_03->considerations)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pmVar3 = std::
             map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
             ::operator[](&this_03->tasks,&p_Var4[1]._M_color);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68._M_pod_data,(pmVar3->debugName)._M_dataplus._M_p,
               (allocator<char> *)&local_74);
    std::vector<float,_std::allocator<float>_>::vector(&local_48,5,&local_75);
    std::vector<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>::
    emplace_back<AI::FUtilityScores>(&this->utilityScores,(FUtilityScores *)&local_68);
    FUtilityScores::~FUtilityScores((FUtilityScores *)&local_68);
  }
  uVar1 = (this_03->considerations)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar1 < 5) {
    for (iVar7 = (int)uVar1 + -5; iVar7 != 0; iVar7 = iVar7 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68._M_pod_data,"",(allocator<char> *)&local_74);
      std::vector<float,_std::allocator<float>_>::vector(&local_48,5,&local_75);
      std::vector<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>::
      emplace_back<AI::FUtilityScores>(&this->utilityScores,(FUtilityScores *)&local_68);
      FUtilityScores::~FUtilityScores((FUtilityScores *)&local_68);
    }
  }
  pHVar2 = local_70;
  local_68._0_4_ = 8;
  pmVar5 = std::
           map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
           ::operator[](&(local_70->state).current.values,(key_type *)local_68._M_pod_data);
  *pmVar5 = 0.0;
  this_00 = &(pHVar2->state).valueTrackers;
  local_74 = Alertness;
  ValueOverTimeTracker::ValueOverTimeTracker((ValueOverTimeTracker *)&local_68);
  std::
  _Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
  ::_M_emplace_unique<WorldStateIdentifier,ValueOverTimeTracker>
            ((_Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
              *)this_00,&local_74,(ValueOverTimeTracker *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  local_74 = Alertness;
  pmVar6 = std::
           map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
           ::operator[](this_00,&local_74);
  local_68._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)&(pmVar6->durationExceedsExtension).super__Function_base._M_functor;
  local_68._8_8_ =
       *(undefined8 *)
        ((long)&(pmVar6->durationExceedsExtension).super__Function_base._M_functor + 8);
  *(undefined8 *)&(pmVar6->durationExceedsExtension).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pmVar6->durationExceedsExtension).super__Function_base._M_functor + 8) = 0
  ;
  local_58._M_allocated_capacity =
       (size_type)(pmVar6->durationExceedsExtension).super__Function_base._M_manager;
  local_58._8_8_ = (pmVar6->durationExceedsExtension)._M_invoker;
  (pmVar6->durationExceedsExtension).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(ValueOverTimeTracker_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/HierarchicalTaskNetworkComponent.cpp:78:3)>
       ::_M_manager;
  (pmVar6->durationExceedsExtension)._M_invoker =
       std::
       _Function_handler<bool_(ValueOverTimeTracker_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/HierarchicalTaskNetworkComponent.cpp:78:3)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_74 = Curiosity;
  ValueOverTimeTracker::ValueOverTimeTracker((ValueOverTimeTracker *)&local_68);
  std::
  _Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
  ::_M_emplace_unique<WorldStateIdentifier,ValueOverTimeTracker>
            ((_Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
              *)this_00,&local_74,(ValueOverTimeTracker *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  local_74 = Curiosity;
  pmVar6 = std::
           map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
           ::operator[](this_00,&local_74);
  local_68._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)&(pmVar6->durationExceedsExtension).super__Function_base._M_functor;
  local_68._8_8_ =
       *(undefined8 *)
        ((long)&(pmVar6->durationExceedsExtension).super__Function_base._M_functor + 8);
  *(undefined8 *)&(pmVar6->durationExceedsExtension).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pmVar6->durationExceedsExtension).super__Function_base._M_functor + 8) = 0
  ;
  local_58._M_allocated_capacity =
       (size_type)(pmVar6->durationExceedsExtension).super__Function_base._M_manager;
  local_58._8_8_ = (pmVar6->durationExceedsExtension)._M_invoker;
  (pmVar6->durationExceedsExtension).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(ValueOverTimeTracker_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/HierarchicalTaskNetworkComponent.cpp:82:3)>
       ::_M_manager;
  (pmVar6->durationExceedsExtension)._M_invoker =
       std::
       _Function_handler<bool_(ValueOverTimeTracker_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/HierarchicalTaskNetworkComponent.cpp:82:3)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_74 = PlayerIdentified;
  ValueOverTimeTracker::ValueOverTimeTracker((ValueOverTimeTracker *)&local_68);
  std::
  _Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
  ::_M_emplace_unique<WorldStateIdentifier,ValueOverTimeTracker>
            ((_Rb_tree<WorldStateIdentifier,std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>,std::_Select1st<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
              *)this_00,&local_74,(ValueOverTimeTracker *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  Barker::operator=(&(local_70->state).barker,&local_70->barker);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::initializeComponent()
{
	auto world = getWorld();
	auto gameMode = world->getAuthGameMode();
	gameMode->registerForFixedTicks(this);
	
	worldQuerySystem.setup(world, owner);

	auto& tasks = gameMode->getAvailableTasks();

	for (auto& kvp : tasks.considerations)
	{
		utilityScores.push_back({tasks.tasks[kvp.first].debugName.c_str(), std::vector<float>(5)});
	}

	if (tasks.considerations.size() < 5)
	{
		for (int j = tasks.considerations.size(); j < 5; j++)
		{
			utilityScores.push_back({"", std::vector<float>(5)});
		}
	}

	state.current.values[WorldStateIdentifier::Stance] = static_cast<float>(Stance::Standing);
	
	state.valueTrackers.emplace(WorldStateIdentifier::Alertness, ValueOverTimeTracker{});
	state.valueTrackers[WorldStateIdentifier::Alertness].durationExceedsExtension =
		[](auto& tracker) {return tracker.durationBelowValue > (tracker.maxValue / 8.f);};

	state.valueTrackers.emplace(WorldStateIdentifier::Curiosity, ValueOverTimeTracker{});
	state.valueTrackers[WorldStateIdentifier::Curiosity].durationExceedsExtension =
		[](auto& tracker) {return tracker.durationBelowValue > (tracker.maxValue / 8.f);};

	state.valueTrackers.emplace(WorldStateIdentifier::PlayerIdentified, ValueOverTimeTracker{});

	state.barker = barker;
}